

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_read_image.cxx
# Opt level: O0

uchar * read_win_rectangle(uchar *p,int X,int Y,int w,int h,int alpha)

{
  ulong uVar1;
  XColor *pXVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *__ptr;
  undefined8 uVar7;
  byte bVar8;
  long lVar11;
  undefined8 in_stack_fffffffffffeced0;
  Fl_Window **ppFVar12;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffeced8;
  undefined4 uVar14;
  XImage *subimg;
  XErrorHandler old_handler_1;
  char *buf;
  int bpp;
  int noffy;
  int noffx;
  int nh;
  int nw;
  XErrorHandler old_handler;
  Fl_Window *win;
  Window child_win;
  int iStack_130a0;
  int sh;
  int sw;
  int sy;
  int sx;
  int dy;
  int dx;
  int allow_outside;
  uint blue_shift;
  uint blue_mask;
  uint green_shift;
  uint green_mask;
  uint red_shift;
  uint red_mask;
  uint index_shift;
  uint index_mask;
  uchar cvals [4096] [3];
  XColor colors [4096];
  uchar *pixel;
  uchar *line_ptr;
  uchar *line;
  int local_48;
  int d;
  int y;
  int x;
  int maxindex;
  int i;
  XImage *image;
  int alpha_local;
  int h_local;
  int w_local;
  int Y_local;
  int X_local;
  uchar *p_local;
  byte bVar9;
  byte bVar10;
  
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffeced0 >> 0x20);
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffeced8 >> 0x20);
  dy = (int)(w < 0);
  alpha_local = w;
  if (w < 0) {
    alpha_local = -w;
  }
  if (dy == 0) {
    old_handler = (XErrorHandler)fl_find(fl_window);
  }
  else {
    old_handler = (XErrorHandler)&DAT_00000001;
  }
  if (old_handler != (XErrorHandler)0x0) {
    ppFVar12 = &win;
    XTranslateCoordinates
              (fl_display,fl_window,
               *(undefined8 *)(*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),X,Y,&sx
               ,&sy,ppFVar12);
    uVar13 = (undefined4)((ulong)ppFVar12 >> 0x20);
    Fl::screen_xywh(&sw,&sh,&iStack_130a0,(int *)((long)&child_win + 4),fl_screen);
  }
  if ((old_handler == (XErrorHandler)0x0) ||
     ((((sw <= sx && (sh <= sy)) && (sx + alpha_local <= sw + iStack_130a0)) &&
      (sy + h <= sh + child_win._4_4_)))) {
    _nh = XSetErrorHandler(xgetimageerrhandler);
    _maxindex = (int *)XGetImage(fl_display,fl_window,X,Y,alpha_local,h,0xffffffffffffffff,
                                 CONCAT44(uVar13,2));
    XSetErrorHandler(_nh);
  }
  else {
    iVar3 = fl_subimage_offsets(sw,iStack_130a0,sx,alpha_local,&noffx);
    iVar4 = fl_subimage_offsets(sh,child_win._4_4_,sy,h,&noffy);
    if ((noffx < 1) || (noffy < 1)) {
      return (uchar *)0x0;
    }
    uVar1 = (long)fl_visual->depth / 8;
    iVar5 = fl_visual->depth +
            (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 2) * 8;
    __ptr = malloc((long)((iVar5 / 8) * alpha_local * h));
    uVar7 = CONCAT44(uVar13,h);
    _maxindex = (int *)XCreateImage(fl_display,fl_visual->visual,fl_visual->depth,2,0,__ptr,
                                    alpha_local,uVar7,CONCAT44(uVar14,iVar5),0);
    uVar13 = (undefined4)((ulong)uVar7 >> 0x20);
    if (_maxindex == (int *)0x0) {
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return (uchar *)0x0;
    }
    uVar7 = XSetErrorHandler(xgetimageerrhandler);
    lVar11 = XGetSubImage(fl_display,fl_window,X + iVar3,Y + iVar4,noffx,noffy,0xffffffffffffffff,
                          CONCAT44(uVar13,2),_maxindex,iVar3,iVar4);
    XSetErrorHandler(uVar7);
    if (lVar11 == 0) {
      (**(code **)(_maxindex + 0x18))(_maxindex);
      return (uchar *)0x0;
    }
  }
  if (_maxindex == (int *)0x0) {
    p_local = (uchar *)0x0;
  }
  else {
    iVar3 = 3;
    if (alpha != 0) {
      iVar3 = 4;
    }
    _Y_local = p;
    if (p == (uchar *)0x0) {
      _Y_local = (uchar *)operator_new__((long)(alpha_local * h * iVar3));
    }
    memset(_Y_local,alpha & 0xff,(long)(alpha_local * h * iVar3));
    if ((*(long *)(_maxindex + 0xe) == 0) && (0xc < _maxindex[0xc])) {
      *(unsigned_long *)(_maxindex + 0xe) = fl_visual->visual->red_mask;
      *(unsigned_long *)(_maxindex + 0x10) = fl_visual->visual->green_mask;
      *(unsigned_long *)(_maxindex + 0x12) = fl_visual->visual->blue_mask;
    }
    if (*(long *)(_maxindex + 0xe) == 0) {
      iVar4 = fl_visual->visual->map_entries;
      for (x = 0; x < iVar4; x = x + 1) {
        lVar11 = (long)x;
        pXVar2 = colors + (long)x + -1;
        pXVar2->red = (short)lVar11;
        pXVar2->green = (short)((ulong)lVar11 >> 0x10);
        pXVar2->blue = (short)((ulong)lVar11 >> 0x20);
        pXVar2->flags = (char)((ulong)lVar11 >> 0x30);
        pXVar2->pad = (char)((ulong)lVar11 >> 0x38);
      }
      XQueryColors(fl_display,fl_colormap,cvals[0xffd] + 1,iVar4);
      for (x = 0; x < iVar4; x = x + 1) {
        *(char *)((long)&index_shift + (long)x * 3) = (char)((ushort)(short)colors[x].pixel >> 8);
        *(char *)((long)&index_shift + (long)x * 3 + 1) =
             (char)((ushort)*(undefined2 *)((long)&colors[x].pixel + 2) >> 8);
        *(char *)((long)&index_shift + (long)x * 3 + 2) =
             (char)((ushort)*(undefined2 *)((long)&colors[x].pixel + 4) >> 8);
      }
      for (local_48 = 0; local_48 < _maxindex[1]; local_48 = local_48 + 1) {
        colors[0xfff]._8_8_ = *(long *)(_maxindex + 4) + (long)(local_48 * _maxindex[0xb]);
        pixel = _Y_local + local_48 * alpha_local * iVar3;
        switch(_maxindex[0xc]) {
        case 1:
          d = *_maxindex;
          red_mask = 0x80;
          for (; 0 < d; d = d + -1) {
            if ((*(byte *)colors[0xfff]._8_8_ & red_mask) == 0) {
              *pixel = (uchar)index_shift;
              pixel[1] = index_shift._1_1_;
              pixel[2] = index_shift._2_1_;
            }
            else {
              *pixel = index_shift._3_1_;
              pixel[1] = (uchar)index_mask;
              pixel[2] = index_mask._1_1_;
            }
            if (red_mask < 2) {
              red_mask = 0x80;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 1;
            }
            else {
              red_mask = red_mask >> 1;
            }
            pixel = pixel + iVar3;
          }
          break;
        case 2:
          d = *_maxindex;
          red_shift = 6;
          for (; 0 < d; d = d + -1) {
            uVar6 = (int)(uint)*(byte *)colors[0xfff]._8_8_ >> ((byte)red_shift & 0x1f) & 3;
            *pixel = *(uchar *)((long)&index_shift + (long)(int)uVar6 * 3);
            pixel[1] = *(uchar *)((long)&index_shift + (long)(int)uVar6 * 3 + 1);
            pixel[2] = *(uchar *)((long)&index_shift + (long)(int)uVar6 * 3 + 2);
            if (red_shift == 0) {
              red_mask = 0xc0;
              red_shift = 6;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 1;
            }
            else {
              red_mask = red_mask >> 2;
              red_shift = red_shift - 2;
            }
            pixel = pixel + iVar3;
          }
          break;
        case 4:
          d = *_maxindex;
          red_shift = 4;
          for (; 0 < d; d = d + -1) {
            if (red_shift == 4) {
              x = (int)(uint)*(byte *)colors[0xfff]._8_8_ >> 4;
            }
            else {
              x = *(byte *)colors[0xfff]._8_8_ & 0xf;
            }
            *pixel = *(uchar *)((long)&index_shift + (long)x * 3);
            pixel[1] = *(uchar *)((long)&index_shift + (long)x * 3 + 1);
            pixel[2] = *(uchar *)((long)&index_shift + (long)x * 3 + 2);
            if (red_shift == 0) {
              red_shift = 4;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 1;
            }
            else {
              red_shift = 0;
            }
            pixel = pixel + iVar3;
          }
          break;
        case 8:
          for (d = *_maxindex; 0 < d; d = d + -1) {
            *pixel = *(uchar *)((long)&index_shift + (ulong)*(byte *)colors[0xfff]._8_8_ * 3);
            pixel[1] = *(uchar *)((long)&index_shift + (ulong)*(byte *)colors[0xfff]._8_8_ * 3 + 1);
            pixel[2] = *(uchar *)((long)&index_shift + (ulong)*(byte *)colors[0xfff]._8_8_ * 3 + 2);
            pixel = pixel + iVar3;
            colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 1;
          }
          break;
        case 0xc:
          d = *_maxindex;
          red_shift = 0;
          for (; 0 < d; d = d + -1) {
            if (red_shift == 0) {
              x = (uint)*(byte *)colors[0xfff]._8_8_ << 4 |
                  (int)(uint)*(byte *)(colors[0xfff]._8_8_ + 1) >> 4;
            }
            else {
              x = CONCAT11(*(undefined1 *)(colors[0xfff]._8_8_ + 1),
                           *(undefined1 *)(colors[0xfff]._8_8_ + 2)) & 0xfff;
            }
            *pixel = *(uchar *)((long)&index_shift + (long)x * 3);
            pixel[1] = *(uchar *)((long)&index_shift + (long)x * 3 + 1);
            pixel[2] = *(uchar *)((long)&index_shift + (long)x * 3 + 2);
            if (red_shift == 0) {
              red_shift = 4;
            }
            else {
              red_shift = 0;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 3;
            }
            pixel = pixel + iVar3;
          }
        }
      }
    }
    else {
      green_shift = 0;
      for (green_mask = (uint)*(undefined8 *)(_maxindex + 0xe); (green_mask & 1) == 0;
          green_mask = green_mask >> 1) {
        green_shift = green_shift + 1;
      }
      blue_shift = 0;
      for (blue_mask = (uint)*(undefined8 *)(_maxindex + 0x10); (blue_mask & 1) == 0;
          blue_mask = blue_mask >> 1) {
        blue_shift = blue_shift + 1;
      }
      dx = 0;
      for (allow_outside = (int)*(undefined8 *)(_maxindex + 0x12); (allow_outside & 1U) == 0;
          allow_outside = (uint)allow_outside >> 1) {
        dx = dx + 1;
      }
      for (local_48 = 0; local_48 < _maxindex[1]; local_48 = local_48 + 1) {
        colors[0xfff]._8_8_ = *(long *)(_maxindex + 4) + (long)(local_48 * _maxindex[0xb]);
        pixel = _Y_local + local_48 * alpha_local * iVar3;
        bVar8 = (byte)green_shift;
        bVar9 = (byte)blue_shift;
        bVar10 = (byte)dx;
        switch(_maxindex[0xc]) {
        case 8:
          for (d = *_maxindex; 0 < d; d = d + -1) {
            uVar6 = (uint)*(byte *)colors[0xfff]._8_8_;
            *pixel = (uchar)((((int)uVar6 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
            pixel[1] = (uchar)((((int)uVar6 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
            pixel[2] = (uchar)((uint)(((int)uVar6 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                              (uint)allow_outside);
            pixel = pixel + iVar3;
            colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 1;
          }
          break;
        case 0xc:
          d = *_maxindex;
          red_shift = 0;
          for (; 0 < d; d = d + -1) {
            if (red_shift == 0) {
              x = (uint)*(byte *)colors[0xfff]._8_8_ << 4 |
                  (int)(uint)*(byte *)(colors[0xfff]._8_8_ + 1) >> 4;
            }
            else {
              x = CONCAT11(*(undefined1 *)(colors[0xfff]._8_8_ + 1),
                           *(undefined1 *)(colors[0xfff]._8_8_ + 2)) & 0xfff;
            }
            *pixel = (uchar)(((x >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
            pixel[1] = (uchar)(((x >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
            pixel[2] = (uchar)((uint)((x >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                              (uint)allow_outside);
            if (red_shift == 0) {
              red_shift = 4;
            }
            else {
              red_shift = 0;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 3;
            }
            pixel = pixel + iVar3;
          }
          break;
        case 0x10:
          if (_maxindex[6] == 0) {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              uVar6 = (uint)*(ushort *)colors[0xfff]._8_8_;
              *pixel = (uchar)((((int)uVar6 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)((((int)uVar6 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)(((int)uVar6 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 2;
            }
          }
          else {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              uVar6 = (uint)CONCAT11(*(undefined1 *)colors[0xfff]._8_8_,
                                     *(undefined1 *)(colors[0xfff]._8_8_ + 1));
              *pixel = (uchar)((((int)uVar6 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)((((int)uVar6 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)(((int)uVar6 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 2;
            }
          }
          break;
        case 0x18:
          if (_maxindex[6] == 0) {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              uVar6 = (uint)*(uint3 *)colors[0xfff]._8_8_;
              *pixel = (uchar)((((int)uVar6 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)((((int)uVar6 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)(((int)uVar6 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 3;
            }
          }
          else {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              uVar6 = (uint)CONCAT21(CONCAT11(*(undefined1 *)colors[0xfff]._8_8_,
                                              *(undefined1 *)(colors[0xfff]._8_8_ + 1)),
                                     *(undefined1 *)(colors[0xfff]._8_8_ + 2));
              *pixel = (uchar)((((int)uVar6 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)((((int)uVar6 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)(((int)uVar6 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 3;
            }
          }
          break;
        case 0x20:
          if (_maxindex[6] == 0) {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              iVar4 = *(int *)colors[0xfff]._8_8_;
              *pixel = (uchar)(((iVar4 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)(((iVar4 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)((iVar4 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 4;
            }
          }
          else {
            for (d = *_maxindex; 0 < d; d = d + -1) {
              iVar4 = CONCAT31(CONCAT21(CONCAT11(*(undefined1 *)colors[0xfff]._8_8_,
                                                 *(undefined1 *)(colors[0xfff]._8_8_ + 1)),
                                        *(undefined1 *)(colors[0xfff]._8_8_ + 2)),
                               *(undefined1 *)(colors[0xfff]._8_8_ + 3));
              *pixel = (uchar)(((iVar4 >> (bVar8 & 0x1f) & green_mask) * 0xff) / green_mask);
              pixel[1] = (uchar)(((iVar4 >> (bVar9 & 0x1f) & blue_mask) * 0xff) / blue_mask);
              pixel[2] = (uchar)((uint)((iVar4 >> (bVar10 & 0x1f) & allow_outside) * 0xff) /
                                (uint)allow_outside);
              pixel = pixel + iVar3;
              colors[0xfff]._8_8_ = colors[0xfff]._8_8_ + 4;
            }
          }
        }
      }
    }
    (**(code **)(_maxindex + 0x18))(_maxindex);
    p_local = _Y_local;
  }
  return p_local;
}

Assistant:

static uchar *read_win_rectangle(uchar *p, int X, int Y, int w, int h, int alpha)
{
  XImage	*image;		// Captured image
  int		i, maxindex;	// Looping vars
  int           x, y;		// Current X & Y in image
  int		d;		// Depth of image
  unsigned char *line,		// Array to hold image row
		*line_ptr;	// Pointer to current line image
  unsigned char	*pixel;		// Current color value
  XColor	colors[4096];	// Colors from the colormap...
  unsigned char	cvals[4096][3];	// Color values from the colormap...
  unsigned	index_mask,
		index_shift,
		red_mask,
		red_shift,
		green_mask,
		green_shift,
		blue_mask,
		blue_shift;


  //
  // Under X11 we have the option of the XGetImage() interface or SGI's
  // ReadDisplay extension which does all of the really hard work for
  // us...
  //
  int allow_outside = w < 0;    // negative w allows negative X or Y, that is, window frame
  if (w < 0) w = - w;

#  ifdef __sgi
  if (XReadDisplayQueryExtension(fl_display, &i, &i)) {
    image = XReadDisplay(fl_display, fl_window, X, Y, w, h, 0, NULL);
  } else
#  else
  image = 0;
#  endif // __sgi

  if (!image) {
    // fetch absolute coordinates
    int dx, dy, sx, sy, sw, sh;
    Window child_win;
    
    Fl_Window *win;
    if (allow_outside) win = (Fl_Window*)1;
    else win = fl_find(fl_window);
    if (win) {
      XTranslateCoordinates(fl_display, fl_window,
          RootWindow(fl_display, fl_screen), X, Y, &dx, &dy, &child_win);
      // screen dimensions
      Fl::screen_xywh(sx, sy, sw, sh, fl_screen);
    }
    if (!win || (dx >= sx && dy >= sy && dx + w <= sx+sw && dy + h <= sy+sh)) {
      // the image is fully contained, we can use the traditional method
      // however, if the window is obscured etc. the function will still fail. Make sure we
      // catch the error and continue, otherwise an exception will be thrown.
      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      image = XGetImage(fl_display, fl_window, X, Y, w, h, AllPlanes, ZPixmap);
      XSetErrorHandler(old_handler);
    } else {
      // image is crossing borders, determine visible region
      int nw, nh, noffx, noffy;
      noffx = fl_subimage_offsets(sx, sw, dx, w, nw);
      noffy = fl_subimage_offsets(sy, sh, dy, h, nh);
      if (nw <= 0 || nh <= 0) return 0;

      // allocate the image
      int bpp = fl_visual->depth + ((fl_visual->depth / 8) % 2) * 8;
      char* buf = (char*)malloc(bpp / 8 * w * h);
      image = XCreateImage(fl_display, fl_visual->visual,
	  fl_visual->depth, ZPixmap, 0, buf, w, h, bpp, 0);
      if (!image) {
	if (buf) free(buf);
	return 0;
      }

      XErrorHandler old_handler = XSetErrorHandler(xgetimageerrhandler);
      XImage *subimg = XGetSubImage(fl_display, fl_window, X + noffx, Y + noffy,
                                    nw, nh, AllPlanes, ZPixmap, image, noffx, noffy);
      XSetErrorHandler(old_handler);
      if (!subimg) {
        XDestroyImage(image);
        return 0;
      }
    }
  }

  if (!image) return 0;

#ifdef DEBUG
  printf("width            = %d\n", image->width);
  printf("height           = %d\n", image->height);
  printf("xoffset          = %d\n", image->xoffset);
  printf("format           = %d\n", image->format);
  printf("data             = %p\n", image->data);
  printf("byte_order       = %d\n", image->byte_order);
  printf("bitmap_unit      = %d\n", image->bitmap_unit);
  printf("bitmap_bit_order = %d\n", image->bitmap_bit_order);
  printf("bitmap_pad       = %d\n", image->bitmap_pad);
  printf("depth            = %d\n", image->depth);
  printf("bytes_per_line   = %d\n", image->bytes_per_line);
  printf("bits_per_pixel   = %d\n", image->bits_per_pixel);
  printf("red_mask         = %08x\n", image->red_mask);
  printf("green_mask       = %08x\n", image->green_mask);
  printf("blue_mask        = %08x\n", image->blue_mask);
  printf("map_entries      = %d\n", fl_visual->visual->map_entries);
#endif // DEBUG

  d = alpha ? 4 : 3;

  // Allocate the image data array as needed...
  if (!p) p = new uchar[w * h * d];

  // Initialize the default colors/alpha in the whole image...
  memset(p, alpha, w * h * d);

  // Check that we have valid mask/shift values...
  if (!image->red_mask && image->bits_per_pixel > 12) {
    // Greater than 12 bits must be TrueColor...
    image->red_mask   = fl_visual->visual->red_mask;
    image->green_mask = fl_visual->visual->green_mask;
    image->blue_mask  = fl_visual->visual->blue_mask;

#ifdef DEBUG
    puts("\n---- UPDATED ----");
    printf("fl_redmask       = %08x\n", fl_redmask);
    printf("fl_redshift      = %d\n", fl_redshift);
    printf("fl_greenmask     = %08x\n", fl_greenmask);
    printf("fl_greenshift    = %d\n", fl_greenshift);
    printf("fl_bluemask      = %08x\n", fl_bluemask);
    printf("fl_blueshift     = %d\n", fl_blueshift);
    printf("red_mask         = %08x\n", image->red_mask);
    printf("green_mask       = %08x\n", image->green_mask);
    printf("blue_mask        = %08x\n", image->blue_mask);
#endif // DEBUG
  }

  // Check if we have colormap image...
  if (!image->red_mask) {
    // Get the colormap entries for this window...
    maxindex = fl_visual->visual->map_entries;

    for (i = 0; i < maxindex; i ++) colors[i].pixel = i;

    XQueryColors(fl_display, fl_colormap, colors, maxindex);

    for (i = 0; i < maxindex; i ++) {
      cvals[i][0] = colors[i].red >> 8;
      cvals[i][1] = colors[i].green >> 8;
      cvals[i][2] = colors[i].blue >> 8;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 1 :
	  for (x = image->width, line_ptr = line, index_mask = 128;
	       x > 0;
	       x --, line_ptr += d) {
	    if (*pixel & index_mask) {
	      line_ptr[0] = cvals[1][0];
	      line_ptr[1] = cvals[1][1];
	      line_ptr[2] = cvals[1][2];
            } else {
	      line_ptr[0] = cvals[0][0];
	      line_ptr[1] = cvals[0][1];
	      line_ptr[2] = cvals[0][2];
            }

            if (index_mask > 1) {
	      index_mask >>= 1;
	    } else {
              index_mask = 128;
              pixel ++;
            }
	  }
          break;

        case 2 :
	  for (x = image->width, line_ptr = line, index_shift = 6;
	       x > 0;
	       x --, line_ptr += d) {
	    i = (*pixel >> index_shift) & 3;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_mask >>= 2;
              index_shift -= 2;
            } else {
              index_mask  = 192;
              index_shift = 6;
              pixel ++;
            }
	  }
          break;

        case 4 :
	  for (x = image->width, line_ptr = line, index_shift = 4;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 4) i = (*pixel >> 4) & 15;
	    else i = *pixel & 15;

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift > 0) {
              index_shift = 0;
	    } else {
              index_shift = 4;
              pixel ++;
            }
	  }
          break;

        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    line_ptr[0] = cvals[*pixel][0];
	    line_ptr[1] = cvals[*pixel][1];
	    line_ptr[2] = cvals[*pixel][2];
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
	    }

	    line_ptr[0] = cvals[i][0];
	    line_ptr[1] = cvals[i][1];
	    line_ptr[2] = cvals[i][2];

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;
      }
    }
  } else {
    // RGB(A) image, so figure out the shifts & masks...
    red_mask  = image->red_mask;
    red_shift = 0;

    while ((red_mask & 1) == 0) {
      red_mask >>= 1;
      red_shift ++;
    }

    green_mask  = image->green_mask;
    green_shift = 0;

    while ((green_mask & 1) == 0) {
      green_mask >>= 1;
      green_shift ++;
    }

    blue_mask  = image->blue_mask;
    blue_shift = 0;

    while ((blue_mask & 1) == 0) {
      blue_mask >>= 1;
      blue_shift ++;
    }

    // Read the pixels and output an RGB image...
    for (y = 0; y < image->height; y ++) {
      pixel = (unsigned char *)(image->data + y * image->bytes_per_line);
      line  = p + y * w * d;

      switch (image->bits_per_pixel) {
        case 8 :
	  for (x = image->width, line_ptr = line;
	       x > 0;
	       x --, line_ptr += d, pixel ++) {
	    i = *pixel;

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	  }
          break;

        case 12 :
	  for (x = image->width, line_ptr = line, index_shift = 0;
	       x > 0;
	       x --, line_ptr += d) {
	    if (index_shift == 0) {
	      i = ((pixel[0] << 4) | (pixel[1] >> 4)) & 4095;
	    } else {
	      i = ((pixel[1] << 8) | pixel[2]) & 4095;
            }

	    line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	    line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	    line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;

            if (index_shift == 0) {
              index_shift = 4;
            } else {
              index_shift = 0;
              pixel += 3;
            }
	  }
          break;

        case 16 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[1] << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 2) {
	      i = (pixel[0] << 8) | pixel[1];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 24 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[2] << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 3) {
	      i = (((pixel[0] << 8) | pixel[1]) << 8) | pixel[2];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;

        case 32 :
          if (image->byte_order == LSBFirst) {
            // Little-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[3] << 8) | pixel[2]) << 8) | pixel[1]) << 8) | pixel[0];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  } else {
            // Big-endian...
	    for (x = image->width, line_ptr = line;
	         x > 0;
	         x --, line_ptr += d, pixel += 4) {
	      i = (((((pixel[0] << 8) | pixel[1]) << 8) | pixel[2]) << 8) | pixel[3];

	      line_ptr[0] = 255 * ((i >> red_shift) & red_mask) / red_mask;
	      line_ptr[1] = 255 * ((i >> green_shift) & green_mask) / green_mask;
	      line_ptr[2] = 255 * ((i >> blue_shift) & blue_mask) / blue_mask;
	    }
	  }
          break;
      }
    }
  }

  // Destroy the X image we've read and return the RGB(A) image...
  XDestroyImage(image);

  return p;
}